

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadFurBall(XMLLoader *this,Ref<embree::XML> *xml)

{
  pointer *ppTVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float *pfVar4;
  undefined4 *puVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  XML *pXVar7;
  string *childID;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  Vec3fa *ptr;
  HairSetNode *pHVar14;
  XMLLoader *pXVar15;
  int iVar16;
  undefined4 uVar17;
  GroupNode *pGVar18;
  TriangleMeshNode *pTVar19;
  pointer pRVar20;
  HairSetNode *pHVar21;
  avector<Vec3ff> *paVar22;
  _Base_ptr p_Var23;
  byte bVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  TriangleMeshNode *pTVar28;
  long lVar29;
  undefined8 uVar30;
  undefined8 *in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar31;
  uchar *extraout_RDX_01;
  Vec3fa **ppVVar32;
  Vec3fx *extraout_RDX_02;
  Vec3fx *pVVar33;
  Vec3fx *extraout_RDX_03;
  Vec3fx *extraout_RDX_04;
  Vec3fx *extraout_RDX_05;
  Vec3fx *extraout_RDX_06;
  int iVar34;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *vertices;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *this_00;
  int iVar35;
  int iVar36;
  long lVar37;
  iterator iVar38;
  _Base_ptr ctx;
  pointer in_R8;
  size_t in_R9;
  uint uVar39;
  ulong uVar40;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *pvVar41;
  _Base_ptr p_Var42;
  uint uVar43;
  undefined4 uVar44;
  undefined8 unaff_R14;
  undefined7 uVar48;
  size_type sVar45;
  long lVar46;
  __atomic_base<unsigned_long> _Var47;
  int offset_b;
  int iVar49;
  __atomic_base<unsigned_long> _Var50;
  __atomic_base<unsigned_long> _Var51;
  bool bVar52;
  bool bVar53;
  float fVar54;
  _Rb_tree_color _Var55;
  float fVar56;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  vfloat4 a_5;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dd_00;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar61 [16];
  float fVar70;
  vfloat4 a_1;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  float fVar82;
  float fVar83;
  vfloat4 a;
  float fVar84;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar85;
  float fVar86;
  vfloat4 a_4;
  float fVar87;
  float fVar88;
  float fVar89;
  vfloat4 a_2;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  vfloat4 a0;
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  string phairtype;
  Ref<embree::SceneGraph::MaterialNode> material;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  byte local_27c;
  byte local_278;
  byte local_274;
  string local_268;
  TriangleMeshNode *local_248;
  ulong local_240;
  byte local_231;
  undefined1 local_230 [84];
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  float local_1bc;
  undefined8 local_1b8;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  value_type local_188;
  value_type local_168;
  undefined8 local_148;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  HairSetNode *local_128;
  GroupNode *local_120;
  Ref<embree::SceneGraph::MaterialNode> local_118;
  Ref<embree::SceneGraph::MaterialNode> local_110;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  FILE *local_e8;
  float local_d8;
  float fStack_d4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d0;
  _Base_ptr local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  float local_78;
  _Base_ptr local_60;
  HairSetNode *local_58;
  XMLLoader *local_50;
  undefined1 local_48 [16];
  undefined1 auVar57 [8];
  
  local_1a8._8_8_ = local_1a8._0_8_;
  local_50 = this;
  pGVar18 = (GroupNode *)operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(pGVar18,0);
  local_120 = pGVar18;
  (*(pGVar18->super_Node).super_RefCount._vptr_RefCount[2])(pGVar18);
  pXVar7 = (XML *)*in_RDX;
  paVar6 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"radius","");
  XML::parm((string *)(local_230 + 0x20),pXVar7,&local_268);
  iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
  if (iVar16 == 0) {
    _local_1d8 = ZEXT812(0x41200000);
    fStack_1cc = 0.0;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_230._0_8_ = local_230 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"radius","");
    local_1d8._0_4_ = XML::parm_float(pXVar7,(string *)local_230);
    local_1d8._4_4_ = extraout_XMM0_Db;
    fStack_1d0 = (float)extraout_XMM0_Dc;
    fStack_1cc = (float)extraout_XMM0_Dd;
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_);
    }
  }
  if ((undefined1 *)local_230._32_8_ != local_230 + 0x30) {
    operator_delete((void *)local_230._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar6) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_268._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"slices","");
  XML::parm((string *)(local_230 + 0x20),pXVar7,&local_268);
  iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
  if (iVar16 == 0) {
    local_1a8._0_8_ = 0x3c;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_230._0_8_ = local_230 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"slices","");
    fVar54 = XML::parm_float(pXVar7,(string *)local_230);
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      local_240 = CONCAT44(local_240._4_4_,fVar54);
      operator_delete((void *)local_230._0_8_);
      fVar54 = (float)local_240;
    }
    local_1a8._0_8_ = ZEXT48((uint)(int)fVar54);
  }
  if ((undefined1 *)local_230._32_8_ != local_230 + 0x30) {
    operator_delete((void *)local_230._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar6) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_268._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"slabs","");
  XML::parm((string *)(local_230 + 0x20),pXVar7,&local_268);
  iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
  if (iVar16 == 0) {
    local_148 = (TriangleMeshNode *)0x3c;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_230._0_8_ = local_230 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"slabs","");
    fVar54 = XML::parm_float(pXVar7,(string *)local_230);
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      local_240 = CONCAT44(local_240._4_4_,fVar54);
      operator_delete((void *)local_230._0_8_);
      fVar54 = (float)local_240;
    }
    local_148 = (TriangleMeshNode *)(ulong)(uint)(int)fVar54;
  }
  if ((undefined1 *)local_230._32_8_ != local_230 + 0x30) {
    operator_delete((void *)local_230._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar6) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_268._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"nhairs","");
  XML::parm((string *)(local_230 + 0x20),pXVar7,&local_268);
  iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
  if (iVar16 == 0) {
    local_230._64_8_ = 30000;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_230._0_8_ = local_230 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"nhairs","");
    fVar54 = XML::parm_float(pXVar7,(string *)local_230);
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      local_240 = CONCAT44(local_240._4_4_,fVar54);
      operator_delete((void *)local_230._0_8_);
      fVar54 = (float)local_240;
    }
    local_230._64_8_ = ZEXT48((uint)(int)fVar54);
  }
  if ((undefined1 *)local_230._32_8_ != local_230 + 0x30) {
    operator_delete((void *)local_230._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar6) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_268._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"hairwidth","");
  XML::parm((string *)(local_230 + 0x20),pXVar7,&local_268);
  iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
  if (iVar16 == 0) {
    local_d8 = (float)local_1d8._0_4_ / 100.0;
    fStack_d4 = (float)local_1d8._4_4_;
    aStack_d0._M_allocated_capacity._0_4_ = fStack_1d0;
    aStack_d0._M_allocated_capacity._4_4_ = fStack_1cc;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_230._0_8_ = local_230 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"hairwidth","");
    fVar54 = XML::parm_float(pXVar7,(string *)local_230);
    local_d8 = (float)(int)fVar54;
    fStack_d4 = (float)(int)extraout_var._0_4_;
    aStack_d0._M_allocated_capacity._0_4_ = (undefined4)(int)extraout_var._4_4_;
    aStack_d0._M_allocated_capacity._4_4_ = (undefined4)(int)extraout_var._8_4_;
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_);
    }
  }
  if ((undefined1 *)local_230._32_8_ != local_230 + 0x30) {
    operator_delete((void *)local_230._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar6) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_268._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"hairlength","");
  XML::parm((string *)(local_230 + 0x20),pXVar7,&local_268);
  iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
  if (iVar16 == 0) {
    local_b8 = (float)local_1d8._0_4_ / 10.0;
    fStack_b4 = (float)local_1d8._4_4_;
    fStack_b0 = fStack_1d0;
    fStack_ac = fStack_1cc;
  }
  else {
    pXVar7 = (XML *)*in_RDX;
    local_230._0_8_ = local_230 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"hairlength","");
    fVar54 = XML::parm_float(pXVar7,(string *)local_230);
    local_b8 = (float)(int)fVar54;
    fStack_b4 = (float)(int)extraout_var_00._0_4_;
    fStack_b0 = (float)(int)extraout_var_00._4_4_;
    fStack_ac = (float)(int)extraout_var_00._8_4_;
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_);
    }
  }
  if ((undefined1 *)local_230._32_8_ != local_230 + 0x30) {
    operator_delete((void *)local_230._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar6) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  pXVar7 = (XML *)*in_RDX;
  local_268._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"hairtype","");
  XML::parm((string *)(local_230 + 0x20),pXVar7,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar6) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
  bVar13 = true;
  if (iVar16 == 0) {
    local_230._72_4_ = 2.38221e-44;
LAB_001836f5:
    bVar52 = false;
LAB_0018371f:
    local_274 = 0;
LAB_00183727:
    local_278 = 1;
LAB_0018372d:
    uVar44 = 0;
LAB_00183730:
    local_27c = 0;
  }
  else {
    iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
    if (iVar16 == 0) {
      local_230._72_4_ = 2.24208e-44;
      goto LAB_001836f5;
    }
    iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
    bVar52 = true;
    if (iVar16 == 0) {
      local_230._72_4_ = 3.50325e-44;
LAB_00183717:
      bVar13 = false;
      goto LAB_0018371f;
    }
    iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
    if (iVar16 == 0) {
      local_230._72_4_ = 3.36312e-44;
      goto LAB_00183717;
    }
    iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
    if (iVar16 != 0) {
      iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
      local_274 = 1;
      if (iVar16 == 0) {
        local_230._72_4_ = 4.62428e-44;
LAB_00184c0d:
        bVar13 = false;
        bVar52 = false;
        goto LAB_00183727;
      }
      iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
      if (iVar16 == 0) {
        local_230._72_4_ = 4.48416e-44;
        goto LAB_00184c0d;
      }
      iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
      local_27c = 1;
      if (iVar16 == 0) {
        local_230._72_4_ = 4.76441e-44;
        local_274 = 1;
        local_278 = 1;
LAB_00184c49:
        bVar52 = false;
        bVar13 = false;
        uVar44 = 0;
        goto LAB_00183738;
      }
      iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
      if (iVar16 == 0) {
        local_230._72_4_ = 5.74532e-44;
LAB_00184c69:
        bVar13 = false;
        bVar52 = false;
        local_274 = 0;
        local_278 = 0;
        goto LAB_0018372d;
      }
      iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
      if (iVar16 == 0) {
        local_230._72_4_ = 5.60519e-44;
        goto LAB_00184c69;
      }
      iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
      if (iVar16 == 0) {
        local_230._72_4_ = 5.88545e-44;
        local_274 = 0;
        local_278 = 0;
        goto LAB_00184c49;
      }
      iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
      local_278 = 1;
      uVar48 = (undefined7)((ulong)unaff_R14 >> 8);
      if (iVar16 == 0) {
        local_230._72_4_ = 8.26766e-44;
      }
      else {
        iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
        if (iVar16 != 0) {
          iVar16 = std::__cxx11::string::compare(local_230 + 0x20);
          bVar52 = iVar16 == 0;
          uVar17 = (undefined4)CONCAT71(uVar48,bVar52);
          local_230._72_4_ = 3.36312e-44;
          if (bVar52) {
            local_230._72_4_ = 8.40779e-44;
          }
          bVar52 = !bVar52;
          uVar44 = uVar17;
          goto LAB_00184bec;
        }
        local_230._72_4_ = 8.12753e-44;
      }
      bVar13 = false;
      bVar52 = false;
      local_274 = 0;
      uVar44 = (undefined4)CONCAT71(uVar48,1);
      goto LAB_00183730;
    }
    bVar52 = true;
    local_230._72_4_ = 3.64338e-44;
    uVar44 = 0;
    uVar17 = 1;
LAB_00184bec:
    local_27c = (byte)uVar17;
    local_278 = 1;
    bVar13 = false;
    local_274 = 0;
  }
LAB_00183738:
  childID = (string *)*in_RDX;
  local_268._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"material","");
  XML::child((XML *)local_230,childID);
  auVar98 = local_1a8;
  loadMaterial((XMLLoader *)local_108,xml);
  if ((long *)local_230._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_230._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar6) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  pTVar19 = (TriangleMeshNode *)operator_new(0xd8);
  local_88 = (_Base_ptr)local_108._0_8_;
  pTVar28 = local_148;
  local_110.ptr = (MaterialNode *)local_108._0_8_;
  local_248 = pTVar19;
  if ((long *)local_108._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_108._0_8_ + 0x10))(local_108._0_8_);
  }
  SceneGraph::TriangleMeshNode::TriangleMeshNode(pTVar19,&local_110,(BBox1f)0x3f80000000000000,0);
  (*(pTVar19->super_Node).super_RefCount._vptr_RefCount[2])(pTVar19);
  local_108._12_4_ = uVar44;
  if (local_110.ptr != (MaterialNode *)0x0) {
    (*((local_110.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  iVar16 = (int)pTVar28;
  iVar26 = auVar98._0_4_;
  sVar45 = (long)(int)((iVar16 - 1U) * iVar26) + 2;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity = 0;
  local_268.field_2._8_8_ = 0;
  local_268.field_2._8_8_ = alignedMalloc(sVar45 * 0x10,0x10);
  alignedFree((void *)0x0);
  _Var55 = local_1d8._0_4_;
  auVar98 = ZEXT416(local_1d8._0_4_ ^ 0x80000000) << 0x20;
  *(undefined1 (*) [16])local_268.field_2._8_8_ = auVar98;
  uVar40 = 0;
  local_268._M_string_length = sVar45;
  local_268.field_2._M_allocated_capacity = sVar45;
  if (1 < iVar16) {
    local_1bc = 3.1415927 / (float)iVar16;
    fVar54 = 3.1415927 / (float)iVar26 + 3.1415927 / (float)iVar26;
    iVar35 = 0;
    auVar57 = local_1d8;
    local_98 = auVar98;
    local_78 = fVar54;
    do {
      uVar39 = (int)uVar40 + 1;
      uVar40 = (ulong)uVar39;
      if (0 < iVar26) {
        local_240 = CONCAT44(local_240._4_4_,(float)(int)uVar39 * local_1bc);
        lVar46 = (long)iVar35 << 4;
        iVar49 = 0;
        do {
          local_1b8 = (vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       *)CONCAT44(local_1b8._4_4_,(float)iVar49 * fVar54);
          local_138 = sinf((float)local_240);
          local_138 = local_138 * (float)local_1d8._0_4_;
          fVar54 = cosf((float)local_1b8);
          local_138 = fVar54 * local_138;
          fStack_134 = extraout_XMM0_Db_00;
          fStack_130 = extraout_XMM0_Dc_00;
          fStack_12c = extraout_XMM0_Dd_00;
          fVar54 = sinf((float)local_240);
          local_198 = (pointer)CONCAT44(extraout_XMM0_Db_01,fVar54 * (float)local_1d8._0_4_);
          fVar54 = sinf((float)local_1b8);
          local_1b8 = (vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       *)CONCAT44(extraout_XMM0_Db_02,fVar54);
          fVar54 = cosf((float)local_240);
          auVar98._4_4_ = fVar54 * (float)local_1d8._0_4_;
          auVar98._0_4_ = local_138;
          auVar98._8_4_ = (float)local_1b8 * (float)local_198;
          auVar98._12_4_ = 0;
          *(undefined1 (*) [16])(local_268.field_2._8_8_ + lVar46) = auVar98;
          iVar49 = iVar49 + 1;
          lVar46 = lVar46 + 0x10;
          fVar54 = local_78;
        } while (iVar26 != iVar49);
        iVar35 = iVar35 + iVar49;
        auVar57 = local_1d8;
      }
      _Var55 = auVar57._0_4_;
    } while (uVar39 != iVar16 - 1U);
    uVar40 = (ulong)iVar35;
    pTVar19 = local_248;
    auVar98 = local_98;
  }
  iVar38._M_current = (Triangle *)&local_268;
  *(undefined1 (*) [16])(local_268.field_2._8_8_ + uVar40 * 0x10) = ZEXT416(_Var55) << 0x20;
  ((undefined1 (*) [16])(local_268.field_2._8_8_ + 0x10))[uVar40] = auVar98;
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::push_back(&pTVar19->positions,(value_type *)iVar38._M_current);
  alignedFree((void *)local_268.field_2._8_8_);
  uVar39 = (uint)(pTVar19->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].size_active;
  local_198 = (pointer)(ulong)uVar39;
  puVar31 = extraout_RDX;
  if (0 < iVar26) {
    pvVar41 = &local_248->triangles;
    uVar43 = local_1a8._0_4_;
    uVar27 = 1;
    do {
      uVar25 = uVar27;
      if (uVar27 == uVar43) {
        uVar25 = 0;
      }
      local_268._M_dataplus._M_p._4_4_ = uVar27 - 1;
      local_268._M_dataplus._M_p._0_4_ = uVar39 - 2;
      local_268._M_string_length = CONCAT44(local_268._M_string_length._4_4_,uVar25);
      iVar38._M_current =
           (local_248->triangles).
           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar38._M_current ==
          (local_248->triangles).
          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
        ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                  (pvVar41,iVar38,(Triangle *)&local_268);
        puVar31 = extraout_RDX_00;
      }
      else {
        (iVar38._M_current)->v2 = uVar25;
        *(pointer *)iVar38._M_current = local_268._M_dataplus._M_p;
        ppTVar1 = &(local_248->triangles).
                   super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      bVar53 = uVar27 != uVar43;
      uVar27 = uVar27 + 1;
    } while (bVar53);
  }
  iVar26 = local_1a8._0_4_;
  pTVar28 = local_148;
  iVar16 = iVar26;
  if (2 < (int)local_148) {
    pTVar28 = (TriangleMeshNode *)(ulong)((int)local_148 - 2);
    local_1b8 = &local_248->triangles;
    puVar31 = (uchar *)(ulong)(uint)-iVar26;
    iVar38._M_current = (Triangle *)0x0;
    pRVar20 = (pointer)local_1a8._0_8_;
    pTVar19 = local_248;
    local_148 = pTVar28;
    do {
      iVar16 = (int)pRVar20;
      iVar35 = (int)iVar38._M_current;
      if (iVar16 < 1) {
        fVar54 = (float)(iVar35 + 1);
      }
      else {
        local_240 = (ulong)(uint)(iVar35 * iVar16);
        local_138 = (float)(iVar35 + 1);
        iVar16 = (int)local_138 * iVar16;
        iVar35 = 0;
        do {
          iVar34 = (int)local_240 + iVar35;
          iVar36 = iVar35 + 1;
          iVar49 = iVar36;
          if (-iVar26 + iVar35 == -1) {
            iVar49 = 0;
          }
          uVar39 = iVar49 + iVar16;
          local_268._M_dataplus._M_p._4_4_ = iVar35 + iVar16;
          local_268._M_dataplus._M_p._0_4_ = iVar34;
          iVar38._M_current =
               (pTVar19->triangles).
               super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar38._M_current ==
              (pTVar19->triangles).
              super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_268._M_string_length._0_4_ = uVar39;
            std::
            vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                      (local_1b8,iVar38,(Triangle *)&local_268);
            iVar38._M_current =
                 (local_248->triangles).
                 super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            pTVar19 = local_248;
          }
          else {
            (iVar38._M_current)->v2 = uVar39;
            *(pointer *)iVar38._M_current = local_268._M_dataplus._M_p;
            iVar38._M_current =
                 (pTVar19->triangles).
                 super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (pTVar19->triangles).
            super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar38._M_current;
          }
          local_268._M_dataplus._M_p._4_4_ = uVar39;
          local_268._M_string_length =
               CONCAT44(local_268._M_string_length._4_4_,iVar49 + (int)(float)local_240);
          if (iVar38._M_current ==
              (pTVar19->triangles).
              super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                      (local_1b8,iVar38,(Triangle *)&local_268);
          }
          else {
            (iVar38._M_current)->v2 = iVar49 + (int)(float)local_240;
            *(pointer *)iVar38._M_current = local_268._M_dataplus._M_p;
            ppTVar1 = &(pTVar19->triangles).
                       super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
          iVar35 = iVar36;
        } while (iVar36 != iVar26);
        pRVar20 = (pointer)local_1a8._0_8_;
        pTVar28 = local_148;
        fVar54 = local_138;
      }
      iVar38._M_current = (Triangle *)(ulong)(uint)fVar54;
      iVar16 = (int)pRVar20;
    } while (fVar54 != SUB84(pTVar28,0));
  }
  if (0 < iVar16) {
    iVar26 = (int)local_198 + -1;
    uVar39 = local_1a8._0_4_;
    iVar35 = ~uVar39 + iVar26;
    pvVar41 = &local_248->triangles;
    iVar16 = 0;
    do {
      iVar49 = iVar16 + 1;
      iVar34 = iVar49;
      if (uVar39 - 1 == iVar16) {
        iVar34 = 0;
      }
      uVar27 = iVar34 + iVar35;
      local_268._M_dataplus._M_p._4_4_ = iVar16 + iVar35;
      local_268._M_dataplus._M_p._0_4_ = iVar26;
      local_268._M_string_length = CONCAT44(local_268._M_string_length._4_4_,uVar27);
      iVar38._M_current =
           (local_248->triangles).
           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pTVar28 = local_248;
      if (iVar38._M_current ==
          (local_248->triangles).
          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
        ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                  (pvVar41,iVar38,(Triangle *)&local_268);
        puVar31 = extraout_RDX_01;
      }
      else {
        (iVar38._M_current)->v2 = uVar27;
        *(pointer *)iVar38._M_current = local_268._M_dataplus._M_p;
        ppTVar1 = &(local_248->triangles).
                   super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      iVar16 = iVar49;
    } while (local_1a8._0_4_ != iVar49);
  }
  pTVar19 = local_248;
  SceneGraph::TriangleMeshNode::verify
            (local_248,(EVP_PKEY_CTX *)iVar38._M_current,puVar31,(size_t)pTVar28,(uchar *)in_R8,
             in_R9);
  pGVar18 = local_120;
  local_268._M_dataplus._M_p = (pointer)pTVar19;
  (*(pTVar19->super_Node).super_RefCount._vptr_RefCount[2])(pTVar19);
  uVar12 = local_230._64_8_;
  if (((TriangleMeshNode *)local_268._M_dataplus._M_p != (TriangleMeshNode *)0x0) &&
     (std::
      vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ::push_back(&pGVar18->children,(value_type *)&local_268),
     (TriangleMeshNode *)local_268._M_dataplus._M_p != (TriangleMeshNode *)0x0)) {
    (**(code **)(*(long *)local_268._M_dataplus._M_p + 0x18))();
  }
  pHVar21 = (HairSetNode *)operator_new(0x118);
  local_118.ptr = (MaterialNode *)local_88;
  local_128 = pHVar21;
  local_58 = pHVar21;
  if (local_88 != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_88 + 0x10))();
  }
  SceneGraph::HairSetNode::HairSetNode
            (pHVar21,local_230._72_4_,&local_118,(BBox1f)0x3f80000000000000,0);
  (*(pHVar21->super_Node).super_RefCount._vptr_RefCount[2])(pHVar21);
  if ((_Base_ptr)local_118.ptr != (_Base_ptr)0x0) {
    (*((local_118.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity = 0;
  local_268.field_2._8_8_ = (avector<Vec3ff> *)0x0;
  local_230._24_8_ = (avector<Vec3ff> *)0x0;
  local_230._8_8_ = 0;
  local_230._16_8_ = (avector<Vec3ff> *)0x0;
  local_168.items = (Vec3fx *)0x0;
  local_c0 = (_Base_ptr)(long)(int)uVar12;
  p_Var42 = (_Base_ptr)((ulong)local_278 + 1);
  _Var47._M_i = (long)local_c0 << (sbyte)p_Var42;
  local_168.size_active = 0;
  local_168.size_alloced = 0;
  local_188.items = (Vec3fa *)0x0;
  local_188.size_active = 0;
  local_188.size_alloced = 0;
  uVar30 = p_Var42;
  if ((int)uVar12 == 0) {
    paVar22 = (avector<Vec3ff> *)0x0;
    _Var50._M_i = (__int_type)(avector<Vec3ff> *)0x0;
  }
  else {
    local_268.field_2._8_8_ = alignedMalloc(_Var47._M_i << 4,0x10);
    alignedFree((void *)0x0);
    paVar22 = (avector<Vec3ff> *)local_230._16_8_;
    _Var50._M_i = local_230._16_8_;
    local_268.field_2._M_allocated_capacity = _Var47._M_i;
    if ((ulong)local_230._16_8_ < _Var47._M_i) {
      if ((avector<Vec3ff> *)local_230._16_8_ == (avector<Vec3ff> *)0x0) {
        paVar22 = (avector<Vec3ff> *)0x0;
        _Var50._M_i = _Var47._M_i;
      }
      else {
        do {
          _Var50._M_i = _Var50._M_i * 2 + (ulong)(_Var50._M_i * 2 == 0);
        } while (_Var50._M_i < _Var47._M_i);
      }
    }
  }
  uVar12 = local_230._24_8_;
  if (_Var47._M_i < (ulong)local_230._8_8_) {
    local_230._8_8_ = _Var47._M_i;
  }
  local_268._M_string_length = _Var47._M_i;
  if (paVar22 != (avector<Vec3ff> *)_Var50._M_i) {
    local_230._24_8_ = alignedMalloc(_Var50._M_i << 4,0x10);
    if ((avector<Vec3ff> *)local_230._8_8_ != (avector<Vec3ff> *)0x0) {
      lVar46 = 0;
      uVar30 = (_Base_ptr)0x0;
      do {
        puVar2 = (undefined8 *)(uVar12 + lVar46);
        uVar11 = puVar2[1];
        puVar3 = (undefined8 *)((long)&((avector<Vec3ff> *)local_230._24_8_)->field_0x0 + lVar46);
        *puVar3 = *puVar2;
        puVar3[1] = uVar11;
        uVar30 = (long)&((_Base_ptr)uVar30)->_M_color + 1;
        lVar46 = lVar46 + 0x10;
      } while ((ulong)uVar30 < (ulong)local_230._8_8_);
    }
    alignedFree((void *)uVar12);
    local_230._16_8_ = _Var50._M_i;
  }
  pVVar33 = local_168.items;
  local_230._8_8_ = _Var47._M_i;
  _Var50._M_i = local_188.size_active;
  if (local_278 == 0) {
    _Var50._M_i = local_168.size_alloced;
    if ((local_168.size_alloced < _Var47._M_i) &&
       (_Var50._M_i = _Var47._M_i, paVar22 = (avector<Vec3ff> *)local_168.size_alloced,
       (avector<Vec3ff> *)local_168.size_alloced != (avector<Vec3ff> *)0x0)) {
      do {
        _Var50._M_i = (long)paVar22 * 2 + (ulong)((long)paVar22 * 2 == 0);
        paVar22 = (avector<Vec3ff> *)_Var50._M_i;
      } while (_Var50._M_i < _Var47._M_i);
    }
    if (_Var47._M_i < local_168.size_active) {
      local_168.size_active = _Var47._M_i;
    }
    if (local_168.size_alloced != _Var50._M_i) {
      local_168.items = (Vec3fx *)alignedMalloc(_Var50._M_i << 4,0x10);
      if ((_Base_ptr)local_168.size_active != (_Base_ptr)0x0) {
        lVar46 = 0;
        uVar30 = (_Base_ptr)0x0;
        do {
          puVar2 = (undefined8 *)((long)&pVVar33->field_0 + lVar46);
          uVar12 = puVar2[1];
          puVar3 = (undefined8 *)((long)&(local_168.items)->field_0 + lVar46);
          *puVar3 = *puVar2;
          puVar3[1] = uVar12;
          uVar30 = (long)&((_Base_ptr)uVar30)->_M_color + 1;
          lVar46 = lVar46 + 0x10;
        } while ((ulong)uVar30 < local_168.size_active);
      }
      alignedFree(pVVar33);
      local_168.size_alloced = _Var50._M_i;
    }
    ptr = local_188.items;
    _Var51._M_i = local_188.size_alloced;
    if ((local_188.size_alloced < _Var47._M_i) &&
       (_Var51._M_i = _Var47._M_i, paVar22 = (avector<Vec3ff> *)local_188.size_alloced,
       (avector<Vec3ff> *)local_188.size_alloced != (avector<Vec3ff> *)0x0)) {
      do {
        _Var51._M_i = (long)paVar22 * 2 + (ulong)((long)paVar22 * 2 == 0);
        paVar22 = (avector<Vec3ff> *)_Var51._M_i;
      } while (_Var51._M_i < _Var47._M_i);
    }
    if (_Var47._M_i < local_188.size_active) {
      local_188.size_active = _Var47._M_i;
    }
    _Var50._M_i = _Var47._M_i;
    local_168.size_active = _Var47._M_i;
    if (local_188.size_alloced != _Var51._M_i) {
      local_188.items = (Vec3fa *)alignedMalloc(_Var51._M_i << 4,0x10);
      if ((_Base_ptr)local_188.size_active != (_Base_ptr)0x0) {
        lVar46 = 0;
        uVar30 = (_Base_ptr)0x0;
        do {
          puVar2 = (undefined8 *)((long)&ptr->field_0 + lVar46);
          uVar12 = puVar2[1];
          puVar3 = (undefined8 *)((long)&(local_188.items)->field_0 + lVar46);
          *puVar3 = *puVar2;
          puVar3[1] = uVar12;
          uVar30 = (long)&((_Base_ptr)uVar30)->_M_color + 1;
          lVar46 = lVar46 + 0x10;
        } while ((ulong)uVar30 < local_188.size_active);
      }
      alignedFree(ptr);
      local_188.size_alloced = _Var51._M_i;
    }
  }
  local_188.size_active = _Var50._M_i;
  local_60 = p_Var42;
  if (0 < (int)local_230._64_4_) {
    local_1d8._4_4_ = local_1d8._0_4_;
    fStack_1d0 = (float)local_1d8._0_4_;
    fStack_1cc = (float)local_1d8._0_4_;
    fStack_140 = local_b8 * -0.01 + 1.0;
    local_148 = (TriangleMeshNode *)CONCAT44(fStack_140,fStack_140);
    local_1bc = local_b8 * 0.03;
    local_230._72_4_ = local_1bc + 1.0;
    fStack_80 = local_b8 * 0.07 + 1.0;
    local_1a8 = ZEXT416((uint)fStack_80);
    local_88 = (_Base_ptr)CONCAT44(fStack_80,fStack_80);
    local_a8 = local_b8;
    fStack_a4 = local_b8;
    fStack_a0 = local_b8;
    fStack_9c = local_b8;
    local_b8 = local_b8 * 0.13;
    local_48 = ZEXT416((uint)(local_d8 * 0.5));
    local_231 = local_278 & local_27c;
    local_98._0_8_ = (local_230._64_8_ & 0xffffffff) << 5;
    iVar16 = 0x7a864a0;
    fVar54 = 0.36814472;
    fVar64 = 0.88034713;
    fVar60 = 0.29909593;
    fVar62 = 0.0;
    lVar46 = 3;
    p_Var42 = (_Base_ptr)0x0;
    lVar37 = 0;
    local_230._76_4_ = local_230._72_4_;
    local_230._80_4_ = local_230._72_4_;
    fStack_1dc = (float)local_230._72_4_;
    fStack_13c = fStack_140;
    fStack_7c = fStack_80;
    do {
      iVar26 = iVar16 * 0x41c64e6d + 0x3039;
      iVar16 = iVar16 * 0x41c64e6d + -0x7fffcfc7;
      if (-1 < iVar26) {
        iVar16 = iVar26;
      }
      iVar26 = iVar16 * 0x41c64e6d + 0x3039;
      iVar35 = iVar16 * 0x41c64e6d + -0x7fffcfc7;
      if (-1 < iVar26) {
        iVar35 = iVar26;
      }
      local_240 = CONCAT44(local_240._4_4_,(float)iVar16 * 4.656613e-10 * 6.2831855);
      local_138 = fVar54;
      fStack_134 = fVar64;
      fStack_130 = fVar60;
      fStack_12c = fVar62;
      fVar54 = acosf(1.0 - ((float)iVar35 * 4.656613e-10 + (float)iVar35 * 4.656613e-10));
      local_1b8._0_4_ = fVar54;
      fVar54 = sinf(fVar54);
      local_198 = (pointer)CONCAT44(local_198._4_4_,fVar54);
      local_78 = cosf((float)local_240);
      local_78 = local_78 * (float)local_198;
      fVar54 = cosf((float)local_1b8);
      local_198 = (pointer)CONCAT44(extraout_XMM0_Db_03,fVar54);
      fVar54 = sinf((float)local_1b8);
      local_1b8 = (vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                   *)CONCAT44(local_1b8._4_4_,fVar54);
      fVar56 = sinf((float)local_240);
      fVar56 = fVar56 * (float)local_1b8;
      fVar60 = fStack_134 * local_78 - local_138 * (float)local_198;
      fVar54 = fStack_130 * (float)local_198 - fStack_134 * fVar56;
      fVar64 = local_138 * fVar56 - fStack_130 * local_78;
      fVar67 = fStack_12c * 0.0 - fStack_12c * 0.0;
      fVar62 = fVar54 * fVar54;
      fVar65 = fVar64 * fVar64;
      fVar68 = fVar67 * fVar67;
      fVar85 = fVar65 + fVar62 + fVar60 * fVar60;
      fVar86 = fVar68 + fVar62 + fVar62;
      fVar65 = fVar65 + fVar62 + fVar65;
      fVar68 = fVar68 + fVar62 + fVar68;
      auVar97._4_4_ = fVar86;
      auVar97._0_4_ = fVar85;
      auVar97._8_4_ = fVar65;
      auVar97._12_4_ = fVar68;
      auVar8._4_4_ = fVar86;
      auVar8._0_4_ = fVar85;
      auVar8._8_4_ = fVar65;
      auVar8._12_4_ = fVar68;
      auVar98 = rsqrtss(auVar97,auVar8);
      fVar62 = auVar98._0_4_;
      fVar62 = fVar62 * fVar62 * fVar85 * -0.5 * fVar62 + fVar62 * 1.5;
      fVar54 = fVar62 * fVar54;
      fVar64 = fVar62 * fVar64;
      fVar60 = fVar62 * fVar60;
      fVar62 = fVar62 * fVar67;
      fVar65 = (float)local_1d8._0_4_ * local_78;
      fVar67 = (float)local_1d8._4_4_ * (float)local_198;
      fVar68 = fStack_1d0 * fVar56;
      fVar85 = fStack_1cc * 0.0;
      iVar26 = iVar35 * 0x41c64e6d + 0x3039;
      iVar16 = iVar35 * 0x41c64e6d + -0x7fffcfc7;
      if (-1 < iVar26) {
        iVar16 = iVar26;
      }
      fVar77 = (float)local_230._72_4_ * fVar65;
      fVar82 = (float)local_230._76_4_ * fVar67;
      fVar83 = (float)local_230._80_4_ * fVar68;
      fVar84 = fStack_1dc * fVar85;
      fVar86 = (float)local_88 * fVar65;
      fVar63 = local_88._4_4_ * fVar67;
      fVar66 = fStack_80 * fVar68;
      fVar69 = fStack_7c * fVar85;
      fVar70 = (float)iVar16 * 4.656613e-10 * local_1bc + (float)local_1a8._0_4_;
      auVar71._0_4_ = fVar70 * fVar65;
      auVar71._4_4_ = fVar70 * fVar67;
      auVar71._8_4_ = fVar70 * fVar68;
      auVar71._12_4_ = fVar70 * fVar85;
      if (bVar52) {
        fVar87 = (float)local_1d8._0_4_ * fVar54 * 0.051 * local_a8;
        fVar88 = (float)local_1d8._4_4_ * fVar64 * 0.051 * fStack_a4;
        fVar89 = fStack_1d0 * fVar60 * 0.051 * fStack_a0;
        fVar70 = fStack_1cc * fVar62 * 0.051 * fStack_9c;
LAB_00184462:
        auVar72._0_4_ = auVar71._0_4_ + fVar87;
        auVar72._4_4_ = auVar71._4_4_ + fVar88;
        auVar72._8_4_ = auVar71._8_4_ + fVar89;
        auVar72._12_4_ = auVar71._12_4_ + fVar70;
        auVar71 = auVar72;
      }
      else {
        if (bVar13) {
          fVar70 = (float)local_1d8._0_4_ * fVar54;
          fVar88 = (float)local_1d8._4_4_ * fVar64;
          fVar89 = fStack_1d0 * fVar60;
          fVar93 = fStack_1cc * fVar62;
          fVar77 = fVar77 + fVar70 * 0.001 * local_a8;
          fVar82 = fVar82 + fVar88 * 0.001 * fStack_a4;
          fVar83 = fVar83 + fVar89 * 0.001 * fStack_a0;
          fVar84 = fVar84 + fVar93 * 0.001 * fStack_9c;
          fVar86 = fVar86 + fVar70 * 0.021 * local_a8;
          fVar63 = fVar63 + fVar88 * 0.021 * fStack_a4;
          fVar66 = fVar66 + fVar89 * 0.021 * fStack_a0;
          fVar69 = fVar69 + fVar93 * 0.021 * fStack_9c;
          fVar87 = fVar70 * 0.051 * local_a8;
          fVar88 = fVar88 * 0.051 * fStack_a4;
          fVar89 = fVar89 * 0.051 * fStack_a0;
          fVar70 = fVar93 * 0.051 * fStack_9c;
          goto LAB_00184462;
        }
        if (local_274 != 0) {
          iVar26 = iVar16 * 0x41c64e6d + 0x3039;
          iVar16 = iVar16 * 0x41c64e6d + -0x7fffcfc7;
          if (-1 < iVar26) {
            iVar16 = iVar26;
          }
          fVar86 = fVar86 + (float)local_1d8._0_4_ * fVar54 * 0.021 * local_a8;
          fVar63 = fVar63 + (float)local_1d8._4_4_ * fVar64 * 0.021 * fStack_a4;
          fVar66 = fVar66 + fStack_1d0 * fVar60 * 0.021 * fStack_a0;
          fVar69 = fVar69 + fStack_1cc * fVar62 * 0.021 * fStack_9c;
          fVar70 = (float)iVar16 * 4.656613e-10 * local_b8 + (float)local_1a8._0_4_;
          fVar87 = fVar70 * fVar65;
          fVar88 = fVar70 * fVar67;
          fVar89 = fVar70 * fVar68;
          fVar70 = fVar70 * fVar85;
          auVar71._0_4_ = (float)local_1d8._0_4_ * fVar54 * 0.081 * local_a8;
          auVar71._4_4_ = (float)local_1d8._4_4_ * fVar64 * 0.081 * fStack_a4;
          auVar71._8_4_ = fStack_1d0 * fVar60 * 0.081 * fStack_a0;
          auVar71._12_4_ = fStack_1cc * fVar62 * 0.081 * fStack_9c;
          goto LAB_00184462;
        }
      }
      fVar65 = fVar65 * (float)local_148;
      fVar67 = fVar67 * local_148._4_4_;
      fVar68 = fVar68 * fStack_140;
      auVar90._0_12_ = auVar71._0_12_;
      if (local_278 == 0) {
        pfVar4 = (float *)((long)&p_Var42->_M_color + local_268.field_2._8_8_);
        *pfVar4 = fVar65;
        pfVar4[1] = fVar67;
        pfVar4[2] = fVar68;
        pfVar4[3] = local_d8;
        auVar74._12_4_ = 0;
        auVar74._0_12_ = auVar90._0_12_;
        *(undefined1 (*) [16])((long)(local_268.field_2._8_8_ + 0x10) + (long)p_Var42) = auVar74;
        fVar65 = (float)local_198 * (float)local_198;
        fVar67 = fVar56 * fVar56;
        fVar68 = fVar65 + local_78 * local_78 + fVar67;
        auVar75._0_8_ = CONCAT44(fVar65 + fVar65 + 0.0,fVar68);
        auVar75._8_4_ = fVar65 + fVar67 + fVar67;
        auVar75._12_4_ = fVar65 + 0.0 + 0.0;
        auVar79._8_4_ = auVar75._8_4_;
        auVar79._0_8_ = auVar75._0_8_;
        auVar79._12_4_ = auVar75._12_4_;
        auVar98 = rsqrtss(auVar79,auVar75);
        fVar65 = auVar98._0_4_;
        fVar65 = fVar65 * 1.5 - fVar65 * fVar65 * fVar68 * 0.5 * fVar65;
        fVar67 = fVar64 * fVar64;
        fVar68 = fVar60 * fVar60;
        fVar85 = fVar62 * fVar62;
        fVar86 = fVar67 + fVar54 * fVar54 + fVar68;
        auVar80._0_8_ = CONCAT44(fVar67 + fVar67 + fVar85,fVar86);
        auVar80._8_4_ = fVar67 + fVar68 + fVar68;
        auVar80._12_4_ = fVar67 + fVar85 + fVar85;
        auVar76._8_4_ = auVar80._8_4_;
        auVar76._0_8_ = auVar80._0_8_;
        auVar76._12_4_ = auVar80._12_4_;
        auVar98 = rsqrtss(auVar76,auVar80);
        fVar67 = auVar98._0_4_;
        fVar67 = fVar67 * 1.5 - fVar67 * fVar67 * fVar86 * 0.5 * fVar67;
        pfVar4 = (float *)((long)&(local_168.items)->field_0 + (long)p_Var42);
        *pfVar4 = fVar65 * local_78;
        pfVar4[1] = fVar65 * (float)local_198;
        pfVar4[2] = fVar65 * fVar56;
        pfVar4[3] = 0.2;
        pfVar4 = (float *)((long)&local_168.items[1].field_0 + (long)p_Var42);
        *pfVar4 = fVar67 * fVar54;
        pfVar4[1] = fVar67 * fVar64;
        pfVar4[2] = fVar67 * fVar60;
        pfVar4[3] = 0.8;
        fVar65 = fVar64 * local_78 - (float)local_198 * fVar54;
        fVar67 = fVar60 * (float)local_198 - fVar56 * fVar64;
        fVar68 = fVar54 * fVar56 - local_78 * fVar60;
        fVar86 = fVar62 * 0.0 - fVar62 * 0.0;
        fVar56 = fVar67 * fVar67;
        fVar85 = fVar68 * fVar68;
        fVar63 = fVar86 * fVar86;
        fVar66 = fVar85 + fVar56 + fVar65 * fVar65;
        auVar81._0_8_ = CONCAT44(fVar63 + fVar56 + fVar56,fVar66);
        auVar81._8_4_ = fVar85 + fVar56 + fVar85;
        auVar81._12_4_ = fVar63 + fVar56 + fVar63;
        auVar61._8_4_ = auVar81._8_4_;
        auVar61._0_8_ = auVar81._0_8_;
        auVar61._12_4_ = auVar81._12_4_;
        auVar98 = rsqrtss(auVar61,auVar81);
        fVar56 = auVar98._0_4_;
        fVar56 = fVar56 * 1.5 - fVar56 * fVar56 * fVar66 * 0.5 * fVar56;
        pfVar4 = (float *)((long)&p_Var42->_M_color + local_230._24_8_);
        *pfVar4 = fVar56 * fVar67;
        pfVar4[1] = fVar56 * fVar68;
        pfVar4[2] = fVar56 * fVar65;
        pfVar4[3] = fVar56 * fVar86;
        pfVar4 = (float *)((long)(local_230._24_8_ + 0x10) + (long)p_Var42);
        *pfVar4 = fVar56 * fVar67;
        pfVar4[1] = fVar56 * fVar68;
        pfVar4[2] = fVar56 * fVar65;
        pfVar4[3] = fVar56 * fVar86;
        uVar30 = local_230._24_8_;
        if (local_27c != 0) {
          lVar29 = lVar37 * 2 + 1;
          fVar65 = 0.0;
          fVar67 = 0.0;
          fVar68 = 0.0;
          fVar56 = 0.0;
          puVar5 = (undefined4 *)((long)&(local_188.items)->field_0 + (long)p_Var42);
          *puVar5 = 0;
          puVar5[1] = 0;
          puVar5[2] = 0;
          puVar5[3] = 0;
          ppVVar32 = &local_188.items;
          goto LAB_0018483b;
        }
      }
      else {
        pfVar4 = (float *)(local_268.field_2._8_8_ + (long)p_Var42 * 2);
        *pfVar4 = fVar65;
        pfVar4[1] = fVar67;
        pfVar4[2] = fVar68;
        pfVar4[3] = local_d8;
        pfVar4 = (float *)((long)(local_268.field_2._8_8_ + 0x10) + (long)p_Var42 * 2);
        *pfVar4 = fVar77;
        pfVar4[1] = fVar82;
        pfVar4[2] = fVar83;
        pfVar4[3] = local_d8;
        pfVar4 = (float *)(&((avector<Vec3ff> *)(local_268.field_2._8_8_ + 0x20))->field_0x0 +
                          (long)p_Var42 * 2);
        *pfVar4 = fVar77;
        pfVar4[1] = fVar63;
        pfVar4[2] = fVar66;
        pfVar4[3] = local_48._0_4_;
        auVar90._12_4_ = 0;
        *(undefined1 (*) [16])((long)(local_268.field_2._8_8_ + 0x30) + (long)p_Var42 * 2) = auVar90
        ;
        uVar30 = local_268.field_2._8_8_;
        if (local_231 != 0) {
          fVar89 = local_78 * fVar64 - (float)local_198 * fVar54;
          fVar93 = (float)local_198 * fVar60 - fVar56 * fVar64;
          fVar95 = fVar56 * fVar54 - local_78 * fVar60;
          fVar96 = fVar62 * 0.0 - fVar62 * 0.0;
          fVar94 = fVar93 * fVar93;
          fVar87 = fVar95 * fVar95;
          fVar88 = fVar96 * fVar96;
          fVar70 = fVar87 + fVar94 + fVar89 * fVar89;
          fVar56 = fVar88 + fVar94 + fVar94;
          fVar87 = fVar87 + fVar94 + fVar87;
          fVar88 = fVar88 + fVar94 + fVar88;
          auVar91._4_4_ = fVar56;
          auVar91._0_4_ = fVar70;
          auVar91._8_4_ = fVar87;
          auVar91._12_4_ = fVar88;
          auVar9._4_4_ = fVar56;
          auVar9._0_4_ = fVar70;
          auVar9._8_4_ = fVar87;
          auVar9._12_4_ = fVar88;
          auVar98 = rsqrtss(auVar91,auVar9);
          fVar56 = auVar98._0_4_;
          fVar56 = fVar56 * 1.5 - fVar56 * fVar56 * fVar70 * 0.5 * fVar56;
          pfVar4 = (float *)(local_230._24_8_ + (long)p_Var42 * 2);
          *pfVar4 = fVar56 * fVar93;
          pfVar4[1] = fVar56 * fVar95;
          pfVar4[2] = fVar56 * fVar89;
          pfVar4[3] = fVar56 * fVar96;
          fVar85 = fVar85 * fStack_13c - fVar84;
          fVar56 = fVar64 * (fVar65 - fVar77) - (fVar67 - fVar82) * fVar54;
          fVar67 = fVar60 * (fVar67 - fVar82) - (fVar68 - fVar83) * fVar64;
          fVar68 = fVar54 * (fVar68 - fVar83) - (fVar65 - fVar77) * fVar60;
          fVar70 = fVar62 * fVar85 - fVar85 * fVar62;
          fVar65 = fVar67 * fVar67;
          fVar85 = fVar68 * fVar68;
          fVar87 = fVar70 * fVar70;
          fVar88 = fVar85 + fVar65 + fVar56 * fVar56;
          fVar89 = fVar87 + fVar65 + fVar65;
          fVar85 = fVar85 + fVar65 + fVar85;
          fVar87 = fVar87 + fVar65 + fVar87;
          auVar58._4_4_ = fVar89;
          auVar58._0_4_ = fVar88;
          auVar58._8_4_ = fVar85;
          auVar58._12_4_ = fVar87;
          auVar10._4_4_ = fVar89;
          auVar10._0_4_ = fVar88;
          auVar10._8_4_ = fVar85;
          auVar10._12_4_ = fVar87;
          auVar98 = rsqrtss(auVar58,auVar10);
          fVar65 = auVar98._0_4_;
          fVar65 = fVar65 * 1.5 - fVar65 * fVar65 * fVar88 * 0.5 * fVar65;
          pfVar4 = (float *)((long)(local_230._24_8_ + 0x10) + (long)p_Var42 * 2);
          *pfVar4 = fVar65 * fVar67;
          pfVar4[1] = fVar65 * fVar68;
          pfVar4[2] = fVar65 * fVar56;
          pfVar4[3] = fVar65 * fVar70;
          fVar56 = fVar64 * (fVar77 - fVar86) - (fVar82 - fVar63) * fVar54;
          fVar67 = fVar60 * (fVar82 - fVar63) - (fVar83 - fVar66) * fVar64;
          fVar68 = fVar54 * (fVar83 - fVar66) - (fVar77 - fVar86) * fVar60;
          fVar70 = fVar62 * (fVar84 - fVar69) - (fVar84 - fVar69) * fVar62;
          fVar65 = fVar67 * fVar67;
          fVar85 = fVar68 * fVar68;
          fVar77 = fVar70 * fVar70;
          fVar82 = fVar85 + fVar65 + fVar56 * fVar56;
          auVar92._0_8_ = CONCAT44(fVar77 + fVar65 + fVar65,fVar82);
          auVar92._8_4_ = fVar85 + fVar65 + fVar85;
          auVar92._12_4_ = fVar77 + fVar65 + fVar77;
          auVar59._8_4_ = auVar92._8_4_;
          auVar59._0_8_ = auVar92._0_8_;
          auVar59._12_4_ = auVar92._12_4_;
          auVar98 = rsqrtss(auVar59,auVar92);
          fVar65 = auVar98._0_4_;
          fVar65 = fVar65 * 1.5 - fVar65 * fVar65 * fVar82 * 0.5 * fVar65;
          pfVar4 = (float *)(&((avector<Vec3ff> *)(local_230._24_8_ + 0x20))->field_0x0 +
                            (long)p_Var42 * 2);
          *pfVar4 = fVar65 * fVar67;
          pfVar4[1] = fVar65 * fVar68;
          pfVar4[2] = fVar65 * fVar56;
          pfVar4[3] = fVar65 * fVar70;
          fVar86 = fVar86 - auVar71._0_4_;
          fVar63 = fVar63 - auVar71._4_4_;
          fVar66 = fVar66 - auVar71._8_4_;
          fVar69 = fVar69 - auVar71._12_4_;
          fVar68 = fVar64 * fVar86 - fVar63 * fVar54;
          fVar65 = fVar60 * fVar63 - fVar66 * fVar64;
          fVar67 = fVar54 * fVar66 - fVar86 * fVar60;
          fVar63 = fVar62 * fVar69 - fVar69 * fVar62;
          fVar85 = fVar65 * fVar65;
          fVar86 = fVar67 * fVar67;
          fVar66 = fVar63 * fVar63;
          fVar56 = fVar86 + fVar85 + fVar68 * fVar68;
          auVar73._0_8_ = CONCAT44(fVar66 + fVar85 + fVar85,fVar56);
          auVar73._8_4_ = fVar86 + fVar85 + fVar86;
          auVar73._12_4_ = fVar66 + fVar85 + fVar66;
          auVar78._8_4_ = auVar73._8_4_;
          auVar78._0_8_ = auVar73._0_8_;
          auVar78._12_4_ = auVar73._12_4_;
          auVar98 = rsqrtss(auVar78,auVar73);
          fVar85 = auVar98._0_4_;
          fVar56 = fVar85 * 1.5 - fVar85 * fVar85 * fVar56 * 0.5 * fVar85;
          fVar65 = fVar56 * fVar65;
          fVar67 = fVar56 * fVar67;
          fVar68 = fVar56 * fVar68;
          fVar56 = fVar56 * fVar63;
          ppVVar32 = (Vec3fa **)(local_230 + 0x18);
          lVar29 = lVar46;
LAB_0018483b:
          uVar30 = lVar29 * 0x10;
          pfVar4 = (float *)((long)&((_Base_ptr)uVar30)->_M_color + (long)*ppVVar32);
          *pfVar4 = fVar65;
          pfVar4[1] = fVar67;
          pfVar4[2] = fVar68;
          pfVar4[3] = fVar56;
        }
      }
      lVar37 = lVar37 + 1;
      p_Var42 = p_Var42 + 1;
      lVar46 = lVar46 + 4;
    } while ((_Base_ptr)local_98._0_8_ != p_Var42);
  }
  pHVar14 = local_58;
  pGVar18 = local_120;
  pHVar21 = local_128;
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::push_back(&local_58->positions,(value_type *)&local_268);
  pXVar15 = local_50;
  p_Var42 = local_c0;
  if (local_27c != 0) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back(&pHVar14->normals,(value_type *)local_230);
  }
  if ((local_278 == 0) &&
     (std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::push_back(&pHVar14->tangents,&local_168), local_27c != 0)) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back(&pHVar14->dnormals,&local_188);
  }
  this_00 = &pHVar14->hairs;
  if (bVar13) {
    ctx = (_Base_ptr)(long)((int)local_230._64_8_ * 3);
    std::
    vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
    ::resize(this_00,(size_type)ctx);
    pVVar33 = extraout_RDX_02;
    if (local_230._64_4_ == 0) goto LAB_00184a58;
    lVar46 = 0x100000001;
    pVVar33 = (Vec3fx *)0x200000002;
    ctx = (_Base_ptr)0x0;
    uVar39 = 0;
    in_R8 = (pointer)0x0;
    do {
      uVar40 = (ulong)uVar39;
      *(ulong *)((long)&in_R8->vertex +
                (long)(this_00->
                      super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                      )._M_impl.super__Vector_impl_data._M_start) = (long)&ctx->_M_color + uVar40;
      *(ulong *)((long)&in_R8->vertex +
                (long)((this_00->
                       super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1)) = lVar46 + uVar40;
      *(uchar **)
       ((long)&in_R8->vertex +
       (long)((this_00->
              super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              )._M_impl.super__Vector_impl_data._M_start + 2)) =
           (uchar *)((long)&pVVar33->field_0 + uVar40);
      in_R8 = in_R8 + 3;
      pVVar33 = pVVar33 + 0x30000000;
      uVar39 = uVar39 + 4;
      lVar46 = lVar46 + 0x300000000;
      ctx = ctx + 0x18000000;
      p_Var42 = (_Base_ptr)((long)&p_Var42[-1]._M_right + 7);
    } while (p_Var42 != (_Base_ptr)0x0);
    in_R9 = 0;
    p_Var42 = local_c0;
  }
  else {
    ctx = p_Var42;
    std::
    vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
    ::resize(this_00,(size_type)p_Var42);
    pVVar33 = extraout_RDX_03;
    if (local_230._64_4_ == 0) goto LAB_00184a58;
    pVVar33 = (Vec3fx *)0x0;
    ctx = (_Base_ptr)0x0;
    do {
      in_R8 = (this_00->
              super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              )._M_impl.super__Vector_impl_data._M_start;
      in_R8[(long)ctx] =
           (Hair)((long)&pVVar33->field_0 +
                 (ulong)((uint)((long)ctx << ((byte)local_60 & 0x3f)) & 0xfffffffe));
      ctx = (_Base_ptr)((long)&ctx->_M_color + 1);
      pVVar33 = pVVar33 + 0x10000000;
    } while (p_Var42 != ctx);
  }
  bVar24 = (byte)local_108._12_4_ | local_274;
  uVar30 = ZEXT48(CONCAT31(SUB43(local_108._12_4_,1),bVar24));
  if ((local_230._64_4_ != 0 & bVar24) == 1) {
    lVar46 = 0;
    uVar30 = p_Var42;
    do {
      *(float *)((long)&(pHVar21->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].items[1].field_0 +
                lVar46 + 0xc) = local_d8 * 0.5;
      *(float *)((long)&(pHVar21->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].items[2].field_0 +
                lVar46 + 0xc) = local_d8 * 0.01;
      pVVar33 = (pHVar21->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].items;
      puVar31 = (uchar *)((long)&pVVar33[3].field_0 + lVar46 + 0xc);
      puVar31[0] = '\0';
      puVar31[1] = '\0';
      puVar31[2] = '\0';
      puVar31[3] = '\0';
      lVar46 = lVar46 + 0x40;
      uVar30 = (long)&((_Base_ptr)(uVar30 + -0x20))->_M_right + 7;
    } while ((_Base_ptr)uVar30 != (_Base_ptr)0x0);
  }
LAB_00184a58:
  if (local_274 != 0) {
    local_f8._M_allocated_capacity = 0;
    local_f8._8_8_ = 0;
    local_e8 = (FILE *)0x0;
    ctx = p_Var42;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_108 + 0x10),
               (size_type)p_Var42);
    if (local_230._64_4_ != 0) {
      p_Var23 = (_Base_ptr)0x0;
      do {
        *(int *)(local_f8._M_allocated_capacity + (long)p_Var23 * 4) = (int)p_Var23;
        p_Var23 = (_Base_ptr)((long)&p_Var23->_M_color + 1);
        uVar30 = local_f8._M_allocated_capacity;
      } while (p_Var42 != p_Var23);
    }
    p_Var42 = (_Base_ptr)
              (pHVar21->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    p_Var23 = (_Base_ptr)
              (pHVar21->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pVVar33 = extraout_RDX_04;
    if (p_Var42 != p_Var23) {
      do {
        ctx = p_Var42;
        fix_bspline_end_points
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_108 + 0x10),
                   (avector<Vec3ff> *)p_Var42);
        p_Var42 = p_Var42 + 1;
        pVVar33 = extraout_RDX_05;
      } while (p_Var42 != p_Var23);
    }
    if ((avector<Vec3ff> *)local_f8._M_allocated_capacity != (avector<Vec3ff> *)0x0) {
      operator_delete((void *)local_f8._M_allocated_capacity);
      pVVar33 = extraout_RDX_06;
    }
  }
  SceneGraph::HairSetNode::verify
            (pHVar21,(EVP_PKEY_CTX *)ctx,(uchar *)pVVar33,uVar30,(uchar *)in_R8,in_R9);
  local_f8._M_allocated_capacity = (size_type)pHVar21;
  (*(pHVar21->super_Node).super_RefCount._vptr_RefCount[2])(pHVar21);
  if (((HairSetNode *)local_f8._M_allocated_capacity != (HairSetNode *)0x0) &&
     (std::
      vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ::push_back(&pGVar18->children,(value_type *)(local_108 + 0x10)),
     (HairSetNode *)local_f8._M_allocated_capacity != (HairSetNode *)0x0)) {
    (**(code **)(*(long *)local_f8._M_allocated_capacity + 0x18))();
  }
  alignedFree(local_188.items);
  alignedFree(local_168.items);
  alignedFree((void *)local_230._24_8_);
  alignedFree((void *)local_268.field_2._8_8_);
  (pXVar15->path).filename._M_dataplus._M_p = (pointer)pGVar18;
  (**(code **)((long)(pGVar18->super_Node).super_RefCount._vptr_RefCount + 0x10))(pGVar18);
  (*(pHVar21->super_Node).super_RefCount._vptr_RefCount[3])(pHVar21);
  (*(local_248->super_Node).super_RefCount._vptr_RefCount[3])();
  if ((long *)local_108._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_108._0_8_ + 0x18))();
  }
  if ((undefined1 *)local_230._32_8_ != local_230 + 0x30) {
    operator_delete((void *)local_230._32_8_);
  }
  (**(code **)((long)(pGVar18->super_Node).super_RefCount._vptr_RefCount + 0x18))(pGVar18);
  return (Ref<embree::SceneGraph::Node>)(Node *)pXVar15;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadFurBall(const Ref<XML>& xml)
  {
    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;

    float r = (xml->parm("radius") != "") ? xml->parm_float("radius") : 10.0f;
    int slices = (xml->parm("slices") != "") ? int(xml->parm_float("slices")) : 60;
    int slabs = (xml->parm("slabs") != "") ? int(xml->parm_float("slabs")) : 60;
    int nhairs = (xml->parm("nhairs") != "") ? int(xml->parm_float("nhairs")) : 30000;
    float hairwidth = (xml->parm("hairwidth") != "") ? int(xml->parm_float("hairwidth")) : (r / 100.0f);
    float hairlength = (xml->parm("hairlength") != "") ? int(xml->parm_float("hairlength")) : (r / 10.0f);
    RTCGeometryType hairtype = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;
    bool is_linear = false;
    bool is_bezier = false;
    bool is_bspline = false;
    bool is_hermite = false;
    bool is_catmulrom = false;
    bool is_normaloriented = false;
    std::string phairtype = xml->parm("hairtype");
    if (phairtype == "linear_flat")                    { hairtype = RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE;                  is_linear = true;                               }
    else if (phairtype == "linear_round")              { hairtype = RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE;                 is_linear = true;                               }
    else if (phairtype == "bezier_flat")               { hairtype = RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;                  is_bezier = true;                               }
    else if (phairtype == "bezier_round")              { hairtype = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;                 is_bezier = true;                               }
    else if (phairtype == "bezier_normaloriented")     { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE;       is_bezier = true;     is_normaloriented = true; }
    else if (phairtype == "bspline_flat")              { hairtype = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;                 is_bspline = true;                              }
    else if (phairtype == "bspline_round")             { hairtype = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;                is_bspline = true;                              }
    else if (phairtype == "bspline_normaloriented")    { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE;      is_bspline = true;    is_normaloriented = true; }
    else if (phairtype == "hermite_flat")              { hairtype = RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;                 is_hermite = true;                              }
    else if (phairtype == "hermite_round")             { hairtype = RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE;                is_hermite = true;                              }
    else if (phairtype == "hermite_normaloriented")    { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE;      is_hermite = true;    is_normaloriented = true; }
    else if (phairtype == "catmulrom_flat")            { hairtype = RTC_GEOMETRY_TYPE_FLAT_CATMULL_ROM_CURVE;             is_catmulrom = true;                            }
    else if (phairtype == "catmulrom_round")           { hairtype = RTC_GEOMETRY_TYPE_ROUND_CATMULL_ROM_CURVE;            is_catmulrom = true;                            }
    else if (phairtype == "catmulrom_normaloriented")  { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_CATMULL_ROM_CURVE;  is_catmulrom = true;  is_normaloriented = true; }
    else                                               { hairtype = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;                 is_bezier = true;                               }

    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),0);

    {
      avector<Vec3fa> data;
      data.resize(slices * (slabs - 1) + 2);
      data[0] = Vec3fa(0, -r, 0);

      float dphi = float(pi) / float(slabs);
      float dtheta = float(pi) / float(slices) * 2.0f;
      int i = 0;

      for (int slab=0; slab<slabs-1; slab++)
      {
        float phi = dphi * (slab + 1);
        for (int slice=0; slice<slices; slice++)
        {
          float theta = dtheta * slice;
          float x = r * sin(phi) * cos(theta);
          float z = r * sin(phi) * sin(theta);
          float y = r * cos(phi);
          data[i] = Vec3fa(x, y, z);
          i++;
        }
      }

      data[i++] = Vec3fa(0, r, 0);
      data[i++] = Vec3fa(0, -r, 0);
      mesh->positions.push_back(data);
    }

    {
      int top = mesh->positions.back().size() - 2;
      int bot = mesh->positions.back().size() - 1;

      for (int slice=0; slice<slices; slice++)
      {
        mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(top, slice, (slice + 1) % slices));
      }

      for (int slab=0; slab<slabs-2; slab++)
      {
        for (int slice=0; slice<slices; slice++)
        {
          int offset_a = slab * slices;
          int offset_b = (slab + 1) * slices;

          mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(offset_a + slice, offset_b + slice, offset_b + (slice + 1) % slices));
          mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(offset_a + slice, offset_b + (slice + 1) % slices, offset_a + (slice + 1) % slices));
        }
      }

      for (int slice=0; slice<slices; slice++)
      {
        mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(bot, bot - slices - 1 + slice, bot - slices - 1+ (slice + 1) % slices));
      }
    }

    mesh->verify();
    group->add(mesh.dynamicCast<SceneGraph::Node>());

    // generate N random hairs
    Ref<SceneGraph::HairSetNode> hairs = new SceneGraph::HairSetNode(hairtype,material,BBox1f(0,1),0);

    int N = nhairs;

    {
      // rand() is not consistent with linux/win/mac or other compilers, so we use a manual lcg (with similar seeds as used in glibc)
      uint32_t rand_int = 1234;
      uint32_t a = 1103515245;
      uint32_t c = 12345;
      uint32_t m = 1 << 31;
      auto rand_float = [&rand_int, &a, &c, &m]() {
        rand_int = (a * rand_int + c) % m;
        return rand_int / float(m);
      };

      size_t nvertices_per_curve = (is_hermite) ? 2 : 4;

      avector<Vec3ff> pos;
      avector<Vec3fa> norm;
      avector<Vec3ff> tans;
      avector<Vec3fa> dnorm;
      pos.resize(N *  nvertices_per_curve);
      norm.resize(N * nvertices_per_curve);
      if (is_hermite) {
        tans.resize(N * nvertices_per_curve);
        dnorm.resize(N * nvertices_per_curve);
      }

      float theta = 2.0f * float(pi) * rand_float();
      float phi = acos(1 - 2 * rand_float());
      Vec3fa last = Vec3fa(sin(phi) * cos(theta), cos(phi), sin(phi) * sin(theta));

      for (int i = 0; i < N; i++) {
          float theta = 2.0f * float(pi) * rand_float();
          float phi = acos(1 - 2 * rand_float());
          Vec3fa d = Vec3fa(sin(phi) * cos(theta), cos(phi), sin(phi) * sin(theta));

          Vec3fa p = normalize(cross(d, last));
          last = p;

          Vec3fa start = d * r * (1.0f - 0.01f * hairlength);
          Vec3fa mid   = d * r * (1.0f + 0.03f * hairlength);
          Vec3fa mid2  = d * r * (1.0f + 0.07f * hairlength);
          Vec3fa stop  = d * r * (1.0f + 0.07f * hairlength + 0.03f * hairlength * rand_float());

          // Tweak positions based on curve type
          if (is_bezier) {
            stop = stop + p * r * 0.051f * hairlength;
          }
          else if (is_linear) {
            mid  = mid  + p * r * 0.001f * hairlength;
            mid2 = mid2 + p * r * 0.021f * hairlength;
            stop = stop + p * r * 0.051f * hairlength;
          }
          else if (is_bspline) {
            mid2 = mid2 + p * r * 0.021f * hairlength;
            stop  = d * r * (1.0f + 0.07f * hairlength + 0.13f * hairlength * rand_float());
            stop = stop + p * r * 0.081f * hairlength;
          }

          // Hermite only has 2 supports
          if (is_hermite) {
            pos[i*2  ] = Vec3ff(start.x, start.y, start.z, hairwidth);
            pos[i*2+1] = Vec3ff(stop.x, stop.y, stop.z, 0.0f);

            Vec3fa tstart = normalize(d);
            Vec3fa tmid = normalize(p);

            tans[i*2  ] = Vec3ff(tstart.x, tstart.y, tstart.z, 0.2f);
            tans[i*2+1] = Vec3ff(tmid.x, tmid.y, tmid.z, 0.8f);

            norm[i*2  ] = normalize(cross(d, p));
            norm[i*2+1] = normalize(cross(d, p));

            if (is_normaloriented) {
              dnorm[i*2  ] = Vec3fa(0.0f, 0.0f, 0.0f);
              dnorm[i*2+1] = Vec3fa(0.0f, 0.0f, 0.0f);
            }
          }
          else {
            pos[i*4+0] = Vec3ff(start.x, start.y, start.z, hairwidth);
            pos[i*4+1] = Vec3ff(mid.x, mid.y, mid.z, hairwidth);
            pos[i*4+2] = Vec3ff(mid.x, mid2.y, mid2.z, hairwidth * 0.5f);
            pos[i*4+3] = Vec3ff(stop.x, stop.y, stop.z, 0.0f);
          }

          // normals already added, if curve type is hermite
          if (is_normaloriented && !is_hermite) {
            norm[i*4+0] = normalize(cross(d, p));
            norm[i*4+1] = normalize(cross(start - mid, p));
            norm[i*4+2] = normalize(cross(mid - mid2, p));
            norm[i*4+3] = normalize(cross(mid2 - stop, p));
          }
      }

      hairs->positions.push_back(pos);
      if (is_normaloriented) hairs->normals.push_back(norm);
      if (is_hermite) hairs->tangents.push_back(tans);
      if (is_hermite && is_normaloriented) hairs->dnormals.push_back(dnorm);

      // linear uses 3 segments per hair
      if (is_linear) {
        hairs->hairs.resize(N * 3);
        for (size_t i=0; i<N; i++) {
          hairs->hairs[i * 3    ] = SceneGraph::HairSetNode::Hair(i * 4    , i * 3    );
          hairs->hairs[i * 3 + 1] = SceneGraph::HairSetNode::Hair(i * 4 + 1, i * 3 + 1);
          hairs->hairs[i * 3 + 2] = SceneGraph::HairSetNode::Hair(i * 4 + 2, i * 3 + 2);
        }
      }
      // rest uses nvertices_per_curve number of supports
      else {
        hairs->hairs.resize(N);
        for (size_t i=0; i<N; i++) {
          hairs->hairs[i] = SceneGraph::HairSetNode::Hair(i * nvertices_per_curve, i);
        }
      }

      // tweak hairwidth of tips to make bsplines/catmulrom look slightly better
      if (is_bspline || is_catmulrom) {
        for (size_t i=0; i<N; i++) { 
          hairs->positions.back()[i * 4 + 1].w = 0.5f * hairwidth;
          hairs->positions.back()[i * 4 + 2].w = 0.01f * hairwidth;
          hairs->positions.back()[i * 4 + 3].w = 0.0f;
        }
      }

      if (is_bspline) {
        std::vector<unsigned> indices;
        indices.resize(N);
        for (size_t i=0; i<N; i++) { indices[i] = i; }
        for (auto& vertices : hairs->positions)
          fix_bspline_end_points(indices,vertices);
      }

      hairs->verify();
      group->add(hairs.dynamicCast<SceneGraph::Node>());
    }

    return group.dynamicCast<SceneGraph::Node>();
  }